

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O3

void duckdb::DuckDBConstraintsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  TableCatalogEntry *this;
  pointer pcVar2;
  SchemaCatalogEntry *pSVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var5;
  undefined8 uVar6;
  pointer pbVar7;
  size_type sVar8;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar9;
  char cVar10;
  bool bVar11;
  reference pvVar12;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *this_00;
  const_reference this_01;
  pointer pCVar13;
  UniqueConstraint *this_02;
  ForeignKeyConstraint *pFVar14;
  string *psVar15;
  idx_t val;
  long lVar16;
  type constraint;
  TableCatalogEntry *table;
  iterator iVar17;
  undefined8 *puVar18;
  CheckConstraint *pCVar19;
  pointer pPVar20;
  _func_int **__n;
  NotImplementedException *this_03;
  char *pcVar21;
  ulong uVar22;
  size_type *psVar23;
  _func_int **pp_Var24;
  char cVar25;
  _func_int **pp_Var26;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var28;
  ExtraConstraintInfo *info_00;
  pointer pLVar29;
  ulong __val;
  pointer pbVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  vector<duckdb::Value,_true> column_index_list;
  Value expression_text;
  string constraint_name;
  string constraint_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<duckdb::Value,_true> referenced_column_name_list;
  vector<duckdb::Value,_true> column_name_list;
  ExtraConstraintInfo info;
  idx_t local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_3c8;
  long lStack_3c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b8 [3];
  GlobalTableFunctionState *local_3a0;
  Value local_398;
  string local_358;
  undefined1 *local_338;
  char *local_330;
  undefined1 local_328 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_318;
  uint local_310;
  undefined4 uStack_30c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_308 [6];
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_298;
  string local_290;
  undefined1 local_270 [32];
  pointer local_250;
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  pointer local_220;
  pointer local_218;
  string local_208;
  string local_1e8;
  vector<duckdb::ConstraintEntry,_true> *local_1c8;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *local_1c0;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_d8;
  undefined8 uStack_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  LogicalType local_b8;
  string local_a0;
  string local_80;
  LogicalType local_60;
  LogicalType local_48;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  local_3a0 = (data_p->global_state).ptr;
  pp_Var26 = local_3a0[4]._vptr_GlobalTableFunctionState;
  if ((_func_int **)
      ((long)local_3a0[2]._vptr_GlobalTableFunctionState -
       (long)local_3a0[1]._vptr_GlobalTableFunctionState >> 5) <= pp_Var26) {
    return;
  }
  local_1c8 = (vector<duckdb::ConstraintEntry,_true> *)(local_3a0 + 1);
  local_298 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)(local_3a0 + 7);
  local_3e8 = 0;
LAB_0112a82d:
  pvVar12 = vector<duckdb::ConstraintEntry,_true>::operator[](local_1c8,(size_type)pp_Var26);
  this = pvVar12->table;
  this_00 = TableCatalogEntry::GetConstraints(this);
  __n = local_3a0[5]._vptr_GlobalTableFunctionState;
  pvVar9 = this_00;
  if (__n < (_func_int **)
            ((long)(this_00->
                   super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->
                   super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3)) {
LAB_0112a86f:
    local_1c0 = pvVar9;
    this_01 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
              ::operator[](this_00,(size_type)__n);
    local_338 = local_328;
    local_330 = (char *)0x0;
    local_328[0] = 0;
    pCVar13 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
              operator->(this_01);
    switch(pCVar13->type) {
    case NOT_NULL:
      info_00 = (ExtraConstraintInfo *)0x8;
      pcVar21 = "NOT NULL";
      break;
    case CHECK:
      info_00 = (ExtraConstraintInfo *)&DAT_00000005;
      pcVar21 = "CHECK";
      break;
    case UNIQUE:
      pCVar13 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->(this_01);
      this_02 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar13);
      bVar11 = UniqueConstraint::IsPrimaryKey(this_02);
      pcVar21 = " UNIQUE";
      if (bVar11) {
        pcVar21 = " PRIMARY KEY";
      }
      info_00 = (ExtraConstraintInfo *)((ulong)bVar11 * 5 + 6);
      ::std::__cxx11::string::_M_replace((ulong)&local_338,0,local_330,(ulong)(pcVar21 + 1));
      goto LAB_0112a994;
    case FOREIGN_KEY:
      pCVar13 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->(this_01);
      pFVar14 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar13);
      if ((pFVar14->info).type != FK_TYPE_PRIMARY_KEY_TABLE) {
        info_00 = (ExtraConstraintInfo *)0xb;
        ::std::__cxx11::string::_M_replace((ulong)&local_338,0,local_330,0x1d8bf4f);
        goto LAB_0112a994;
      }
      goto LAB_0112b6b6;
    default:
      this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_270._0_8_ = local_270 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_270,"Unimplemented constraint for duckdb_constraints","");
      NotImplementedException::NotImplementedException(this_03,(string *)local_270);
      __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::_M_replace((ulong)&local_338,0,local_330,(ulong)pcVar21);
LAB_0112a994:
    psVar15 = Catalog::GetName_abi_cxx11_
                        ((((this->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    pcVar2 = (psVar15->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar2,pcVar2 + psVar15->_M_string_length);
    Value::Value((Value *)local_270,&local_138);
    DataChunk::SetValue(output,0,local_3e8,(Value *)local_270);
    Value::~Value((Value *)local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    val = Catalog::GetOid((((this->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
    lVar16 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
    Value::BIGINT((Value *)local_270,lVar16);
    DataChunk::SetValue(output,1,local_3e8,(Value *)local_270);
    Value::~Value((Value *)local_270);
    pSVar3 = (this->super_StandardEntry).schema;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    pcVar2 = (pSVar3->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar2,
               pcVar2 + (pSVar3->super_InCatalogEntry).super_CatalogEntry.name._M_string_length);
    Value::Value((Value *)local_270,&local_158);
    DataChunk::SetValue(output,2,local_3e8,(Value *)local_270);
    Value::~Value((Value *)local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    lVar16 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                       ((((this->super_StandardEntry).schema)->super_InCatalogEntry).
                        super_CatalogEntry.oid);
    Value::BIGINT((Value *)local_270,lVar16);
    DataChunk::SetValue(output,3,local_3e8,(Value *)local_270);
    Value::~Value((Value *)local_270);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    pcVar2 = (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name._M_dataplus.
             _M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar2,
               pcVar2 + (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                        _M_string_length);
    Value::Value((Value *)local_270,&local_178);
    DataChunk::SetValue(output,4,local_3e8,(Value *)local_270);
    Value::~Value((Value *)local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    lVar16 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                       ((this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid);
    Value::BIGINT((Value *)local_270,lVar16);
    DataChunk::SetValue(output,5,local_3e8,(Value *)local_270);
    Value::~Value((Value *)local_270);
    constraint = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator*(this_01);
    GetExtraConstraintInfo((ExtraConstraintInfo *)local_270,this,constraint);
    table = (TableCatalogEntry *)
            unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator*
                      (this_01);
    GetConstraintName_abi_cxx11_(&local_358,(duckdb *)this,table,(Constraint *)local_270,info_00);
    iVar17 = ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(local_298,&local_358);
    if (iVar17.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      __val = 2;
      do {
        local_318 = local_308;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_318,local_358._M_dataplus._M_p,
                   local_358._M_dataplus._M_p + local_358._M_string_length);
        ::std::__cxx11::string::append((char *)&local_318);
        cVar25 = '\x01';
        if (9 < __val) {
          uVar22 = __val;
          cVar10 = '\x04';
          do {
            cVar25 = cVar10;
            if (uVar22 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0112aca9;
            }
            if (uVar22 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0112aca9;
            }
            if (uVar22 < 10000) goto LAB_0112aca9;
            bVar11 = 99999 < uVar22;
            uVar22 = uVar22 / 10000;
            cVar10 = cVar25 + '\x04';
          } while (bVar11);
          cVar25 = cVar25 + '\x01';
        }
LAB_0112aca9:
        local_3c8 = local_3b8;
        ::std::__cxx11::string::_M_construct((ulong)&local_3c8,cVar25);
        ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_3c8,(uint)lStack_3c0,__val)
        ;
        _Var27._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if (local_318 != local_308) {
          _Var27._M_pi = local_308[0]._M_pi;
        }
        p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (lStack_3c0 + CONCAT44(uStack_30c,local_310));
        if (_Var27._M_pi < p_Var1) {
          p_Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if (local_3c8 != local_3b8) {
            p_Var28 = local_3b8[0];
          }
          if (p_Var28 < p_Var1) goto LAB_0112ad28;
          puVar18 = (undefined8 *)
                    ::std::__cxx11::string::replace
                              ((ulong)&local_3c8,0,(char *)0x0,(ulong)local_318);
        }
        else {
LAB_0112ad28:
          puVar18 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_3c8);
        }
        psVar23 = puVar18 + 2;
        if ((size_type *)*puVar18 == psVar23) {
          local_398.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar23;
          local_398._24_8_ = puVar18[3];
          local_398.type_._0_8_ =
               &local_398.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        else {
          local_398.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar23;
          local_398.type_._0_8_ = (size_type *)*puVar18;
        }
        local_398.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)puVar18[1];
        *puVar18 = psVar23;
        puVar18[1] = 0;
        *(char *)psVar23 = '\0';
        iVar17 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(local_298,(key_type *)&local_398);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_398.type_._0_8_ !=
            &local_398.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_398.type_._0_8_);
        }
        if (local_3c8 != local_3b8) {
          operator_delete(local_3c8);
        }
        if (local_318 != local_308) {
          operator_delete(local_318);
        }
        if (iVar17.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_0112aded;
        __val = __val + 1;
      } while( true );
    }
    goto LAB_0112af10;
  }
  pp_Var26 = local_3a0[4]._vptr_GlobalTableFunctionState;
  goto LAB_0112b712;
LAB_0112aded:
  cVar25 = '\x01';
  pp_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_398.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (9 < __val) {
    uVar22 = __val;
    cVar10 = '\x04';
    do {
      cVar25 = cVar10;
      if (uVar22 < 100) {
        cVar25 = cVar25 + -2;
        goto LAB_0112ae42;
      }
      if (uVar22 < 1000) {
        cVar25 = cVar25 + -1;
        goto LAB_0112ae42;
      }
      if (uVar22 < 10000) goto LAB_0112ae42;
      bVar11 = 99999 < uVar22;
      uVar22 = uVar22 / 10000;
      cVar10 = cVar25 + '\x04';
    } while (bVar11);
    cVar25 = cVar25 + '\x01';
  }
LAB_0112ae42:
  local_318 = local_308;
  ::std::__cxx11::string::_M_construct((ulong)&local_318,cVar25);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_318,local_310,__val);
  puVar18 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,0x1dd10b4)
  ;
  psVar23 = puVar18 + 2;
  if ((size_type *)*puVar18 == psVar23) {
    local_398.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar23;
    local_398._24_8_ = puVar18[3];
    local_398.type_._0_8_ = pp_Var5;
  }
  else {
    local_398.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar23;
    local_398.type_._0_8_ = (size_type *)*puVar18;
  }
  local_398.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar18[1];
  *puVar18 = psVar23;
  puVar18[1] = 0;
  *(undefined1 *)(puVar18 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&local_358,local_398.type_._0_8_);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_398.type_._0_8_ != pp_Var5) {
    operator_delete((void *)local_398.type_._0_8_);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
LAB_0112af10:
  pp_Var26 = local_3a0[6]._vptr_GlobalTableFunctionState;
  local_3a0[6]._vptr_GlobalTableFunctionState = (_func_int **)((long)pp_Var26 + 1);
  lVar16 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)pp_Var26);
  Value::BIGINT(&local_398,lVar16);
  DataChunk::SetValue(output,6,local_3e8,&local_398);
  Value::~Value(&local_398);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_338,local_330 + (long)local_338);
  Value::Value(&local_398,&local_198);
  DataChunk::SetValue(output,7,local_3e8,&local_398);
  Value::~Value(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  pCVar13 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
            operator->(this_01);
  (*pCVar13->_vptr_Constraint[2])(&local_80,pCVar13);
  Value::Value(&local_398,&local_80);
  DataChunk::SetValue(output,8,local_3e8,&local_398);
  Value::~Value(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_48,SQLNULL);
  Value::Value(&local_398,&local_48);
  LogicalType::~LogicalType(&local_48);
  pCVar13 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
            operator->(this_01);
  if (pCVar13->type == CHECK) {
    pCVar13 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
              operator->(this_01);
    pCVar19 = Constraint::Cast<duckdb::CheckConstraint>(pCVar13);
    pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&pCVar19->expression);
    (*(pPVar20->super_BaseExpression)._vptr_BaseExpression[8])(&local_a0,pPVar20);
    Value::Value((Value *)&local_318,&local_a0);
    Value::operator=(&local_398,(Value *)&local_318);
    Value::~Value((Value *)&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  DataChunk::SetValue(output,9,local_3e8,&local_398);
  uVar6 = local_270._8_8_;
  local_3c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)0x0;
  lStack_3c0 = 0;
  local_3b8[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2a8 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  for (pLVar29 = (pointer)local_270._0_8_; pbVar7 = local_250, pLVar29 != (pointer)uVar6;
      pLVar29 = pLVar29 + 1) {
    Value::UBIGINT((Value *)&local_318,pLVar29->index);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_3c8,
               (Value *)&local_318);
    Value::~Value((Value *)&local_318);
  }
  if ((pointer)local_270._24_8_ != local_250) {
    paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_270._24_8_ + 0x10);
    do {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (paVar31 + -1))->_M_dataplus)._M_p;
      if (paVar31 == paVar4) {
        local_1e8.field_2._M_allocated_capacity = paVar31->_M_allocated_capacity;
        local_1e8.field_2._8_8_ = *(undefined8 *)((long)paVar31 + 8);
      }
      else {
        local_1e8.field_2._M_allocated_capacity = paVar31->_M_allocated_capacity;
        local_1e8._M_dataplus._M_p = (pointer)paVar4;
      }
      local_1e8._M_string_length = *(size_type *)((long)paVar31 + -8);
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar31 + -1))->
      _M_dataplus)._M_p = (pointer)paVar31;
      *(size_type *)((long)paVar31 + -8) = 0;
      paVar31->_M_local_buf[0] = '\0';
      Value::Value((Value *)&local_318,&local_1e8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_2b8,
                 (Value *)&local_318);
      Value::~Value((Value *)&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      pbVar30 = (pointer)(paVar31 + 1);
      paVar31 = paVar31 + 2;
    } while (pbVar30 != pbVar7);
  }
  pbVar7 = local_218;
  if (local_220 != local_218) {
    paVar31 = &local_220->field_2;
    do {
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (paVar31 + -1))->_M_dataplus)._M_p;
      if (paVar31 == paVar4) {
        local_208.field_2._M_allocated_capacity = paVar31->_M_allocated_capacity;
        local_208.field_2._8_8_ = *(undefined8 *)((long)paVar31 + 8);
      }
      else {
        local_208.field_2._M_allocated_capacity = paVar31->_M_allocated_capacity;
        local_208._M_dataplus._M_p = (pointer)paVar4;
      }
      local_208._M_string_length = *(size_type *)((long)paVar31 + -8);
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar31 + -1))->
      _M_dataplus)._M_p = (pointer)paVar31;
      *(size_type *)((long)paVar31 + -8) = 0;
      paVar31->_M_local_buf[0] = '\0';
      Value::Value((Value *)&local_318,&local_208);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_2d8,
                 (Value *)&local_318);
      Value::~Value((Value *)&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      pbVar30 = (pointer)(paVar31 + 1);
      paVar31 = paVar31 + 2;
    } while (pbVar30 != pbVar7);
  }
  LogicalType::LogicalType(&local_b8,BIGINT);
  local_d8 = local_3c8;
  uStack_d0 = lStack_3c0;
  local_c8 = local_3b8[0];
  local_3c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)0x0;
  lStack_3c0 = 0;
  local_3b8[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Value::LIST((Value *)&local_318,&local_b8,(vector<duckdb::Value,_true> *)&local_d8);
  DataChunk::SetValue(output,10,local_3e8,(Value *)&local_318);
  Value::~Value((Value *)&local_318);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8);
  LogicalType::~LogicalType(&local_b8);
  LogicalType::LogicalType(&local_b8,VARCHAR);
  local_f8 = local_2b8;
  uStack_f0 = uStack_2b0;
  local_e8 = local_2a8;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 0;
  Value::LIST((Value *)&local_318,&local_b8,(vector<duckdb::Value,_true> *)&local_f8);
  DataChunk::SetValue(output,0xb,local_3e8,(Value *)&local_318);
  Value::~Value((Value *)&local_318);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f8);
  LogicalType::~LogicalType(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p == &local_358.field_2) {
    local_1b8.field_2._8_8_ = local_358.field_2._8_8_;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  }
  else {
    local_1b8._M_dataplus._M_p = local_358._M_dataplus._M_p;
  }
  local_1b8.field_2._M_allocated_capacity._1_7_ = local_358.field_2._M_allocated_capacity._1_7_;
  local_1b8.field_2._M_local_buf[0] = local_358.field_2._M_local_buf[0];
  local_1b8._M_string_length = local_358._M_string_length;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  Value::Value((Value *)&local_318,&local_1b8);
  DataChunk::SetValue(output,0xc,local_3e8,(Value *)&local_318);
  Value::~Value((Value *)&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  sVar8 = local_238;
  if (local_238 == 0) {
    LogicalType::LogicalType(&local_60,SQLNULL);
    Value::Value((Value *)&local_318,&local_60);
  }
  else {
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_p == &local_230) {
      local_290.field_2._8_8_ = local_230._8_8_;
    }
    else {
      local_290._M_dataplus._M_p = local_240._M_p;
    }
    local_290.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
    local_290.field_2._M_local_buf[0] = local_230._M_local_buf[0];
    local_290._M_string_length = local_238;
    local_238 = 0;
    local_230._M_local_buf[0] = '\0';
    local_240._M_p = (pointer)&local_230;
    Value::Value((Value *)&local_318,&local_290);
  }
  DataChunk::SetValue(output,0xd,local_3e8,(Value *)&local_318);
  Value::~Value((Value *)&local_318);
  if (sVar8 == 0) {
    LogicalType::~LogicalType(&local_60);
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_b8,VARCHAR);
  local_118 = local_2d8;
  uStack_110 = uStack_2d0;
  local_108 = local_2c8;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2c8 = 0;
  Value::LIST((Value *)&local_318,&local_b8,(vector<duckdb::Value,_true> *)&local_118);
  DataChunk::SetValue(output,0xe,local_3e8,(Value *)&local_318);
  Value::~Value((Value *)&local_318);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_118);
  LogicalType::~LogicalType(&local_b8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_2d8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_2b8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_3c8);
  Value::~Value(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_220);
  this_00 = local_1c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_p != &local_230) {
    operator_delete(local_240._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_270 + 0x18));
  if ((pointer)local_270._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_270._0_8_);
  }
  local_3e8 = local_3e8 + 1;
LAB_0112b6b6:
  if (local_338 != local_328) {
    operator_delete(local_338);
  }
  __n = (_func_int **)((long)local_3a0[5]._vptr_GlobalTableFunctionState + 1);
  local_3a0[5]._vptr_GlobalTableFunctionState = __n;
  pp_Var24 = (_func_int **)
             ((long)(this_00->
                    super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this_00->
                    super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((pp_Var24 <= __n) || (pvVar9 = local_1c0, 0x7ff < local_3e8)) goto LAB_0112b6fe;
  goto LAB_0112a86f;
LAB_0112b6fe:
  pp_Var26 = local_3a0[4]._vptr_GlobalTableFunctionState;
  if (pp_Var24 <= __n) {
LAB_0112b712:
    local_3a0[5]._vptr_GlobalTableFunctionState = (_func_int **)0x0;
    pp_Var26 = (_func_int **)((long)pp_Var26 + 1);
    local_3a0[4]._vptr_GlobalTableFunctionState = pp_Var26;
  }
  if (((_func_int **)
       ((long)local_3a0[2]._vptr_GlobalTableFunctionState -
        (long)local_3a0[1]._vptr_GlobalTableFunctionState >> 5) <= pp_Var26) || (0x7ff < local_3e8))
  {
    output->count = local_3e8;
    return;
  }
  goto LAB_0112a82d;
}

Assistant:

void DuckDBConstraintsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBConstraintsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset];

		auto &table = entry.table;
		auto &constraints = table.GetConstraints();
		for (; data.constraint_offset < constraints.size() && count < STANDARD_VECTOR_SIZE; data.constraint_offset++) {
			auto &constraint = constraints[data.constraint_offset];
			// return values:
			// constraint_type, VARCHAR
			// Processing this first due to shortcut (early continue)
			string constraint_type;
			switch (constraint->type) {
			case ConstraintType::CHECK:
				constraint_type = "CHECK";
				break;
			case ConstraintType::UNIQUE: {
				auto &unique = constraint->Cast<UniqueConstraint>();
				constraint_type = unique.IsPrimaryKey() ? "PRIMARY KEY" : "UNIQUE";
				break;
			}
			case ConstraintType::NOT_NULL:
				constraint_type = "NOT NULL";
				break;
			case ConstraintType::FOREIGN_KEY: {
				auto &fk = constraint->Cast<ForeignKeyConstraint>();
				if (fk.info.type == ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE) {
					// Those are already covered by PRIMARY KEY and UNIQUE entries
					continue;
				}
				constraint_type = "FOREIGN KEY";
				break;
			}
			default:
				throw NotImplementedException("Unimplemented constraint for duckdb_constraints");
			}

			idx_t col = 0;
			// database_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.schema.catalog.GetName()));
			// database_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.schema.catalog.GetOid())));
			// schema_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.schema.name));
			// schema_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.schema.oid)));
			// table_name, LogicalType::VARCHAR
			output.SetValue(col++, count, Value(table.name));
			// table_oid, LogicalType::BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table.oid)));

			auto info = GetExtraConstraintInfo(table, *constraint);
			auto constraint_name = GetConstraintName(table, *constraint, info);
			if (data.constraint_names.find(constraint_name) != data.constraint_names.end()) {
				// duplicate constraint name
				idx_t index = 2;
				while (data.constraint_names.find(constraint_name + "_" + to_string(index)) !=
				       data.constraint_names.end()) {
					index++;
				}
				constraint_name += "_" + to_string(index);
			}
			// constraint_index, BIGINT
			output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(data.unique_constraint_offset++)));

			// constraint_type, VARCHAR
			output.SetValue(col++, count, Value(constraint_type));

			// constraint_text, VARCHAR
			output.SetValue(col++, count, Value(constraint->ToString()));

			// expression, VARCHAR
			Value expression_text;
			if (constraint->type == ConstraintType::CHECK) {
				auto &check = constraint->Cast<CheckConstraint>();
				expression_text = Value(check.expression->ToString());
			}
			output.SetValue(col++, count, expression_text);

			vector<Value> column_index_list;
			vector<Value> column_name_list;
			vector<Value> referenced_column_name_list;
			for (auto &col_index : info.column_indexes) {
				column_index_list.push_back(Value::UBIGINT(col_index.index));
			}
			for (auto &name : info.column_names) {
				column_name_list.push_back(Value(std::move(name)));
			}
			for (auto &name : info.referenced_columns) {
				referenced_column_name_list.push_back(Value(std::move(name)));
			}
			// constraint_column_indexes, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::BIGINT, std::move(column_index_list)));

			// constraint_column_names, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, std::move(column_name_list)));

			// constraint_name, VARCHAR
			output.SetValue(col++, count, Value(std::move(constraint_name)));

			// referenced_table, VARCHAR
			output.SetValue(col++, count,
			                info.referenced_table.empty() ? Value() : Value(std::move(info.referenced_table)));

			// referenced_column_names, LIST
			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, std::move(referenced_column_name_list)));
			count++;
		}

		if (data.constraint_offset >= constraints.size()) {
			data.constraint_offset = 0;
			data.offset++;
		}
	}
	output.SetCardinality(count);
}